

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPlatform.hpp
# Opt level: O0

void __thiscall vk::PlatformMemoryLimits::PlatformMemoryLimits(PlatformMemoryLimits *this)

{
  PlatformMemoryLimits *this_local;
  
  this->totalSystemMemory = 0;
  this->totalDeviceLocalMemory = 0;
  this->deviceMemoryAllocationGranularity = 0;
  this->devicePageSize = 0;
  this->devicePageTableEntrySize = 0;
  this->devicePageTableHierarchyLevels = 0;
  return;
}

Assistant:

PlatformMemoryLimits (void)
		: totalSystemMemory					(0)
		, totalDeviceLocalMemory			(0)
		, deviceMemoryAllocationGranularity	(0)
		, devicePageSize					(0)
		, devicePageTableEntrySize			(0)
		, devicePageTableHierarchyLevels	(0)
	{}